

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_obj.c
# Opt level: O3

void obj_moveinletfirst(t_object *x,_inlet *i)

{
  _inlet *p_Var1;
  _inlet *p_Var2;
  _inlet *p_Var3;
  
  p_Var1 = x->te_inlet;
  p_Var2 = p_Var1;
  if (p_Var1 != i) {
    do {
      p_Var3 = p_Var2;
      if (p_Var3 == (_inlet *)0x0) {
        return;
      }
      p_Var2 = p_Var3->i_next;
    } while (p_Var3->i_next != i);
    p_Var3->i_next = i->i_next;
    i->i_next = p_Var1;
    x->te_inlet = i;
  }
  return;
}

Assistant:

void obj_moveinletfirst(t_object *x, t_inlet *i)
{
    t_inlet *i2;
    if (x->ob_inlet == i) return;
    else for (i2 = x->ob_inlet; i2; i2 = i2->i_next)
        if (i2->i_next == i)
    {
        i2->i_next = i->i_next;
        i->i_next = x->ob_inlet;
        x->ob_inlet = i;
        return;
    }
}